

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicAtomicCase3::RunIteration
          (BasicAtomicCase3 *this,uvec3 *param_1,bool dispatch_indirect)

{
  bool bVar1;
  GLuint GVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  GLint location;
  void *pvVar6;
  uint local_a4;
  GLint i_1;
  GLint *idata;
  GLuint i;
  GLuint *udata;
  bool ret;
  GLuint num_groups [3];
  GLuint values [8];
  GLuint kBufferSize;
  string local_48;
  byte local_21;
  uvec3 *puStack_20;
  bool dispatch_indirect_local;
  uvec3 *local_size_local;
  BasicAtomicCase3 *this_local;
  
  local_21 = dispatch_indirect;
  puStack_20 = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  glcts::(anonymous_namespace)::BasicAtomicCase3::GenSource_abi_cxx11_(&local_48,this,puStack_20);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_48);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    uVar3 = tcu::Vector<unsigned_int,_3>::x(puStack_20);
    uVar4 = tcu::Vector<unsigned_int,_3>::y(puStack_20);
    uVar5 = tcu::Vector<unsigned_int,_3>::z(puStack_20);
    uVar5 = uVar3 * uVar4 * uVar5;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,(ulong)uVar5 << 3,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    num_groups[1] = 3;
    num_groups[2] = 1;
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,this->m_program,"g_uint_value");
    glu::CallLogWrapper::glUniform1uiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,location,8,num_groups + 1);
    if ((local_21 & 1) == 0) {
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
    }
    else {
      stack0xffffffffffffff7c = 0x100000001;
      num_groups[0] = 1;
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,(void *)((long)&udata + 4),0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    udata._3_1_ = 1;
    pvVar6 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x90d2,0,(ulong)uVar5 << 2,1);
    for (idata._4_4_ = 0; idata._4_4_ < uVar5; idata._4_4_ = idata._4_4_ + 1) {
      if (*(int *)((long)pvVar6 + (ulong)idata._4_4_ * 4) != 7) {
        anon_unknown_0::Output
                  ("uData at index %d is %d should be %d.\n",(ulong)idata._4_4_,
                   (ulong)*(uint *)((long)pvVar6 + (ulong)idata._4_4_ * 4),7);
        udata._3_1_ = 0;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    pvVar6 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x90d2,(ulong)uVar5 << 2,(ulong)uVar5 << 2,1);
    for (local_a4 = 0; (int)local_a4 < (int)uVar5; local_a4 = local_a4 + 1) {
      if (*(int *)((long)pvVar6 + (long)(int)local_a4 * 4) != 7) {
        anon_unknown_0::Output
                  ("iData at index %d is %d should be %d.\n",(ulong)local_a4,
                   (ulong)*(uint *)((long)pvVar6 + (long)(int)local_a4 * 4),7);
        udata._3_1_ = 0;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local._7_1_ = (bool)(udata._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RunIteration(const uvec3& local_size, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize = local_size.x() * local_size.y() * local_size.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize * 2, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		GLuint values[8] = { 3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value"), 8, values);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool	ret = true;
		GLuint* udata;
		udata = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		GLint* idata;
		idata = static_cast<GLint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize,
													 sizeof(GLint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return ret;
	}